

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

string * common_chat_format_single_abi_cxx11_
                   (common_chat_templates *tmpls,
                   vector<common_chat_msg,_std::allocator<common_chat_msg>_> *past_msg,
                   common_chat_msg *new_msg,bool add_ass,bool use_jinja)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  string *in_RDI;
  undefined1 in_R8B;
  undefined1 in_R9B;
  string fmt_new_msg;
  ostringstream ss;
  string fmt_past_msg;
  common_chat_templates_inputs inputs;
  common_chat_params *in_stack_fffffffffffffbf0;
  common_chat_templates_inputs *this;
  value_type *in_stack_fffffffffffffbf8;
  vector<common_chat_msg,_std::allocator<common_chat_msg>_> *in_stack_fffffffffffffc00;
  string *this_00;
  string local_3c0 [40];
  string local_398 [32];
  vector<common_chat_msg,_std::allocator<common_chat_msg>_> *in_stack_fffffffffffffc88;
  vector<common_chat_msg,_std::allocator<common_chat_msg>_> *in_stack_fffffffffffffc90;
  string local_308 [32];
  ostringstream local_2e8 [384];
  string asStack_168 [160];
  common_chat_templates_inputs local_c8;
  undefined1 local_22;
  undefined1 local_21;
  
  local_21 = in_R8B & COMMON_CHAT_TOOL_CHOICE_REQUIRED;
  local_22 = in_R9B & 1;
  common_chat_templates_inputs::common_chat_templates_inputs
            ((common_chat_templates_inputs *)in_stack_fffffffffffffbf0);
  local_c8.tool_choice._1_1_ = local_22 & 1;
  std::__cxx11::string::string((string *)&local_c8);
  bVar1 = std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::empty
                    (in_stack_fffffffffffffc00);
  if (!bVar1) {
    std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::operator=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_c8.tool_choice._0_1_ = COMMON_CHAT_TOOL_CHOICE_AUTO;
    common_chat_templates_apply
              ((common_chat_templates *)in_stack_fffffffffffffbf8,
               (common_chat_templates_inputs *)in_stack_fffffffffffffbf0);
    std::__cxx11::string::operator=((string *)&local_c8,asStack_168);
    common_chat_params::~common_chat_params(in_stack_fffffffffffffbf0);
  }
  std::__cxx11::ostringstream::ostringstream(local_2e8);
  if ((local_21 & COMMON_CHAT_TOOL_CHOICE_REQUIRED) != COMMON_CHAT_TOOL_CHOICE_AUTO) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::back();
      if (*pcVar3 == '\n') {
        std::operator<<((ostream *)local_2e8,"\n");
      }
    }
  }
  std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::push_back
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  local_c8.tool_choice._0_1_ = local_21 & COMMON_CHAT_TOOL_CHOICE_REQUIRED;
  common_chat_templates_apply
            ((common_chat_templates *)in_stack_fffffffffffffbf8,
             (common_chat_templates_inputs *)in_stack_fffffffffffffbf0);
  this_00 = local_308;
  std::__cxx11::string::string(this_00,local_398);
  common_chat_params::~common_chat_params(in_stack_fffffffffffffbf0);
  this = &local_c8;
  std::__cxx11::string::size();
  std::__cxx11::string::size();
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_3c0,(ulong)this_00);
  std::operator<<((ostream *)local_2e8,local_3c0);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string(local_308);
  std::__cxx11::ostringstream::~ostringstream(local_2e8);
  std::__cxx11::string::~string((string *)&local_c8);
  common_chat_templates_inputs::~common_chat_templates_inputs(this);
  return in_RDI;
}

Assistant:

std::string common_chat_format_single(
        const struct common_chat_templates * tmpls,
        const std::vector<common_chat_msg> & past_msg,
        const common_chat_msg & new_msg,
        bool add_ass,
        bool use_jinja) {

    common_chat_templates_inputs inputs;
    inputs.use_jinja = use_jinja;

    std::string fmt_past_msg;
    if (!past_msg.empty()) {
        inputs.messages = past_msg;
        inputs.add_generation_prompt = false;
        fmt_past_msg = common_chat_templates_apply(tmpls, inputs).prompt;
    }
    std::ostringstream ss;
    // if the past_msg ends with a newline, we must preserve it in the formatted version
    if (add_ass && !fmt_past_msg.empty() && fmt_past_msg.back() == '\n') {
        ss << "\n";
    };
    // format chat with new_msg
    inputs.messages.push_back(new_msg);
    inputs.add_generation_prompt = add_ass;
    auto fmt_new_msg = common_chat_templates_apply(tmpls, inputs).prompt;
    // get the diff part
    ss << fmt_new_msg.substr(fmt_past_msg.size(), fmt_new_msg.size() - fmt_past_msg.size());
    return ss.str();
}